

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

void __thiscall File::setText(File *this,string *text)

{
  u16string local_38;
  
  UtfHandler::utf8to16(&local_38,&this->utf,text);
  TextBuffer::set_text(&this->buffer,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity * 2 + 2);
  }
  if (this->hasParser == true) {
    ts_tree_delete(this->tree);
    this->tree = (TSTree *)0x0;
    executeParse(this);
  }
  return;
}

Assistant:

void File::setText (std::string &&text) {
    buffer.set_text(utf.utf8to16(text));

    if (hasParser) {
        ts_tree_delete(tree);
        tree = nullptr;
        executeParse();
    }
}